

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-mon-list.c
# Opt level: O1

void monster_list_get_glyphs(monster_list_t *list)

{
  monster_list_entry_t *pmVar1;
  long lVar2;
  _Bool _Var3;
  long lVar4;
  long lVar5;
  
  if (0 < (int)list->entries_size) {
    lVar4 = 0x24;
    lVar5 = 0;
    do {
      pmVar1 = list->entries;
      lVar2 = *(long *)((long)pmVar1->count + lVar4 + -0x34);
      if (lVar2 != 0) {
        if (*(char *)((long)pmVar1->count + lVar4 + -0x10) == '\0') {
          *(uint8_t *)((long)pmVar1->count + lVar4 + -0x10) = monster_x_attr[*(uint *)(lVar2 + 8)];
        }
        if (((-1 < *(char *)((long)pmVar1->count + lVar4 + -0x10)) &&
            ((player->opts).opt[0x10] == true)) &&
           (_Var3 = flag_has_dbg((bitflag *)(lVar2 + 0x5c),0xc,1,"entry->race->flags","RF_UNIQUE"),
           _Var3)) {
          *(undefined1 *)((long)pmVar1->count + lVar4 + -0x10) = 0x11;
        }
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x28;
    } while (lVar5 < (int)list->entries_size);
  }
  return;
}

Assistant:

static void monster_list_get_glyphs(monster_list_t *list)
{
	int i;

	/* Run through all monsters in the list. */
	for (i = 0; i < (int)list->entries_size; i++) {
		monster_list_entry_t *entry = &list->entries[i];
		if (entry->race == NULL)
			continue;

		/* If no monster attribute use the standard UI picture. */
		if (!entry->attr)
			entry->attr = monster_x_attr[entry->race->ridx];
		/* If purple_uniques is relevant, apply it. */
		if (!(entry->attr & 0x80) && OPT(player, purple_uniques)
				&& rf_has(entry->race->flags, RF_UNIQUE)) {
			entry->attr = COLOUR_VIOLET;
		}
	}
}